

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O3

void nbt_free_list(nbt_list *list)

{
  list_head *plVar1;
  list_head *plVar2;
  
  if (list == (nbt_list *)0x0) {
    return;
  }
  plVar2 = (list->entry).flink;
  while (plVar2 != &list->entry) {
    plVar1 = plVar2->flink;
    nbt_free((nbt_node *)plVar2[-1].flink);
    free(&plVar2[-1].flink);
    plVar2 = plVar1;
  }
  free(list->data);
  free(list);
  return;
}

Assistant:

void nbt_free_list(struct nbt_list* list)
{
    if (!list)
        return;

    struct list_head* current;
    struct list_head* temp;
    list_for_each_safe(current, temp, &list->entry)
    {
        struct nbt_list* entry = list_entry(current, struct nbt_list, entry);

        nbt_free(entry->data);
        free(entry);
    }

    free(list->data);
    free(list);
}